

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.h
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::Event
          (Event *this,Type type,StringPiece name)

{
  undefined1 local_20 [8];
  StringPiece name_local;
  
  name_local.ptr_ = (char *)name.length_;
  local_20 = (undefined1  [8])name.ptr_;
  this->type_ = type;
  StringPiece::ToString_abi_cxx11_(&this->name_,(StringPiece *)local_20);
  (this->value_)._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
  (this->value_).type_ = TYPE_NULL;
  (this->value_).field_2.i32_ = 0;
  (this->value_).use_strict_base64_decoding_ = false;
  (this->value_storage_)._M_dataplus._M_p = (pointer)&(this->value_storage_).field_2;
  (this->value_storage_)._M_string_length = 0;
  (this->value_storage_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Event(Type type, StringPiece name)
          : type_(type), name_(name), value_(DataPiece::NullData()) {}